

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O2

void csp_eth_arp_get_addr(uint8_t *mac_addr,uint16_t csp_addr)

{
  arp_list_entry_t *paVar1;
  arp_list_entry_t **ppaVar2;
  
  ppaVar2 = &arp_list;
  while( true ) {
    paVar1 = *ppaVar2;
    if (paVar1 == (arp_list_entry_t *)0x0) {
      mac_addr[4] = 0xff;
      mac_addr[5] = 0xff;
      mac_addr[0] = 0xff;
      mac_addr[1] = 0xff;
      mac_addr[2] = 0xff;
      mac_addr[3] = 0xff;
      return;
    }
    if (paVar1->csp_addr == csp_addr) break;
    ppaVar2 = &paVar1->next;
  }
  *(undefined2 *)(mac_addr + 4) = *(undefined2 *)(paVar1->mac_addr + 4);
  *(undefined4 *)mac_addr = *(undefined4 *)paVar1->mac_addr;
  return;
}

Assistant:

void csp_eth_arp_get_addr(uint8_t * mac_addr, uint16_t csp_addr)
{
    for (arp_list_entry_t * arp = arp_list; arp ; arp = arp->next) {
        if (arp->csp_addr == csp_addr) {
            memcpy(mac_addr, arp->mac_addr, CSP_ETH_ALEN);
            return;
        }
    }
    // Defaults to returning the broadcast address
    memset(mac_addr, 0xff, CSP_ETH_ALEN);
}